

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

exr_result_t unpack_16bit(exr_decode_pipeline_t *decode)

{
  int iVar1;
  exr_coding_channel_info_t *peVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint8_t *__dest;
  long lVar6;
  ulong uVar7;
  void *__src;
  
  __src = decode->unpacked_buffer;
  lVar3 = (long)decode->channel_count;
  if (lVar3 < 1) {
    iVar5 = decode->user_line_begin_skip;
  }
  else {
    iVar5 = decode->user_line_begin_skip;
    lVar6 = 0;
    do {
      __src = (void *)((long)__src +
                      (long)(*(int *)((long)&decode->channels->width + lVar6) * iVar5 * 2));
      lVar6 = lVar6 + 0x30;
    } while (lVar3 * 0x30 != lVar6);
  }
  uVar4 = (decode->chunk).height - (decode->user_line_end_ignore + iVar5);
  if (0 < (int)uVar4) {
    uVar7 = 0;
    do {
      if (0 < (short)lVar3) {
        lVar6 = 0;
        do {
          peVar2 = decode->channels;
          iVar5 = peVar2[lVar6].width;
          iVar1 = peVar2[lVar6].user_pixel_stride;
          __dest = peVar2[lVar6].field_12.decode_to_ptr +
                   (long)peVar2[lVar6].user_line_stride * uVar7;
          if ((long)iVar1 == 2) {
            memcpy(__dest,__src,(long)iVar5 * 2);
          }
          else if (0 < iVar5) {
            lVar3 = 0;
            do {
              *(undefined2 *)__dest = *(undefined2 *)((long)__src + lVar3 * 2);
              __dest = __dest + iVar1;
              lVar3 = lVar3 + 1;
            } while (iVar5 != (int)lVar3);
          }
          __src = (void *)((long)__src + (long)(iVar5 * 2));
          lVar6 = lVar6 + 1;
          lVar3 = (long)decode->channel_count;
        } while (lVar6 < lVar3);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar4);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t* srcbuffer = decode->unpacked_buffer;
    uint8_t*       cdata;
    int            w, h, pixincrement;

    h = decode->chunk.height - decode->user_line_end_ignore;
    /*
     * if we have user_line_begin_skip, the user data pointer is at THAT
     * offset but our unpacked data is at y of '0' (well idx * height)
     */
    for (int c = 0; c < decode->channel_count; ++c)
    {
        exr_coding_channel_info_t* decc = (decode->channels + c);
        srcbuffer += decc->width * decode->user_line_begin_skip * 2;
    }
    h -= decode->user_line_begin_skip;

    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata        = decc->decode_to_ptr;
            w            = decc->width;
            pixincrement = decc->user_pixel_stride;
            cdata += (uint64_t) y * (uint64_t) decc->user_line_stride;
            /* specialize to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
            if (pixincrement == 2)
            {
                uint16_t*       tmp = (uint16_t*) cdata;
                const uint16_t* src = (const uint16_t*) srcbuffer;
                uint16_t*       end = tmp + w;

                while (tmp < end)
                    *tmp++ = one_to_native16 (*src++);
            }
            else
            {
                const uint16_t* src = (const uint16_t*) srcbuffer;
                for (int x = 0; x < w; ++x)
                {
                    *((uint16_t*) cdata) = one_to_native16 (*src++);
                    cdata += pixincrement;
                }
            }
#else
            if (pixincrement == 2)
            {
                memcpy (cdata, srcbuffer, (size_t) (w) * 2);
            }
            else
            {
                const uint16_t* src = (const uint16_t*) srcbuffer;
                for (int x = 0; x < w; ++x)
                {
                    *((uint16_t*) cdata) = *src++;
                    cdata += pixincrement;
                }
            }
#endif
            srcbuffer += w * 2;
        }
    }
    return EXR_ERR_SUCCESS;
}